

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

size_t __thiscall
absl::time_internal::cctz::TimeZoneInfo::Header::DataLength(Header *this,size_t time_len)

{
  size_t len;
  size_t time_len_local;
  Header *this_local;
  
  return this->ttisutcnt +
         this->ttisstdcnt +
         (time_len + 4) * this->leapcnt +
         this->charcnt + this->typecnt * 6 + (time_len + 1) * this->timecnt;
}

Assistant:

std::size_t TimeZoneInfo::Header::DataLength(std::size_t time_len) const {
  std::size_t len = 0;
  len += (time_len + 1) * timecnt;  // unix_time + type_index
  len += (4 + 1 + 1) * typecnt;     // utc_offset + is_dst + abbr_index
  len += 1 * charcnt;               // abbreviations
  len += (time_len + 4) * leapcnt;  // leap-time + TAI-UTC
  len += 1 * ttisstdcnt;            // UTC/local indicators
  len += 1 * ttisutcnt;             // standard/wall indicators
  return len;
}